

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeConfig.cpp
# Opt level: O3

string * anon_unknown.dwarf_3241e::config_var_name
                   (string *__return_storage_ptr__,string *name,string *key)

{
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  long *plVar5;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  undefined4 extraout_var;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  size_type sVar10;
  string *local_a8;
  long local_a0;
  string local_98;
  ulong local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  string *psVar6;
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"CALI_","");
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)local_48,(ulong)(name->_M_dataplus)._M_p)
  ;
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_78 = *puVar7;
    uStack_70 = (undefined4)plVar5[3];
    uStack_6c = *(undefined4 *)((long)plVar5 + 0x1c);
    local_98.field_2._M_allocated_capacity = (size_type)&local_78;
  }
  else {
    local_78 = *puVar7;
    local_98.field_2._M_allocated_capacity = (size_type)(ulong *)*plVar5;
  }
  local_98.field_2._8_8_ = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"_","");
  uVar9 = 0xf;
  if ((ulong *)local_98.field_2._M_allocated_capacity != &local_78) {
    uVar9 = local_78;
  }
  if (uVar9 < (ulong)(local_60 + local_98.field_2._8_8_)) {
    uVar9 = 0xf;
    if (local_68 != local_58) {
      uVar9 = local_58[0];
    }
    if ((ulong)(local_60 + local_98.field_2._8_8_) <= uVar9) {
      plVar5 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_68,0,(char *)0x0,
                                  local_98.field_2._M_allocated_capacity);
      goto LAB_00189f13;
    }
  }
  plVar5 = (long *)std::__cxx11::string::_M_append(local_98.field_2._M_local_buf,(ulong)local_68);
LAB_00189f13:
  local_a8 = &local_98;
  psVar6 = (string *)(plVar5 + 2);
  if ((string *)*plVar5 == psVar6) {
    local_98._M_dataplus._M_p = (psVar6->_M_dataplus)._M_p;
    local_98._M_string_length = plVar5[3];
  }
  else {
    local_98._M_dataplus._M_p = (psVar6->_M_dataplus)._M_p;
    local_a8 = (string *)*plVar5;
  }
  local_a0 = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)&(psVar6->_M_dataplus)._M_p = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)(key->_M_dataplus)._M_p)
  ;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  psVar6 = &local_98;
  if (local_a8 != psVar6) {
    operator_delete(local_a8,(ulong)(local_98._M_dataplus._M_p + 1));
    psVar6 = extraout_RAX;
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
    psVar6 = extraout_RAX_00;
  }
  if ((ulong *)local_98.field_2._M_allocated_capacity != &local_78) {
    operator_delete((void *)local_98.field_2._M_allocated_capacity,local_78 + 1);
    psVar6 = extraout_RAX_01;
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
    psVar6 = extraout_RAX_02;
  }
  sVar1 = __return_storage_ptr__->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar10 = 0;
    do {
      iVar4 = toupper((int)pcVar2[sVar10]);
      psVar6 = (string *)CONCAT44(extraout_var,iVar4);
      pcVar2[sVar10] = (char)iVar4;
      sVar10 = sVar10 + 1;
    } while (sVar1 != sVar10);
  }
  return psVar6;
}

Assistant:

std::string config_var_name(const std::string& name, const std::string& key)
{
    // make uppercase PREFIX_NAMESPACE_KEY string

    std::string str = std::string("CALI_") + name + std::string("_") + key;
    std::transform(str.begin(), str.end(), str.begin(), ::toupper);

    return str;
}